

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cc
# Opt level: O0

void __thiscall GraphViz::AddTarget(GraphViz *this,Node *node)

{
  value_type pNVar1;
  value_type pNVar2;
  Edge *pEVar3;
  Node *pNVar4;
  bool bVar5;
  string *psVar6;
  undefined8 uVar7;
  size_type sVar8;
  reference ppNVar9;
  size_t index;
  reference ppNVar10;
  pair<std::_Rb_tree_const_iterator<Node_*>,_bool> pVar11;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_110;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_108;
  iterator in_1;
  char *local_f8;
  char *order_only;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_e8;
  iterator in;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_d8;
  iterator out;
  string err;
  _Self local_a0;
  _Self local_98;
  undefined4 local_8c;
  Edge *local_88;
  Edge *edge;
  undefined1 local_78;
  char local_5a [2];
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48 [8];
  string pathstr;
  _Self local_20;
  Node *local_18;
  Node *node_local;
  GraphViz *this_local;
  
  local_18 = node;
  node_local = (Node *)this;
  local_20._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::find
                 (&this->visited_nodes_,&local_18);
  pathstr.field_2._8_8_ =
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end(&this->visited_nodes_);
  bVar5 = std::operator!=(&local_20,(_Self *)((long)&pathstr.field_2 + 8));
  if (!bVar5) {
    psVar6 = Node::path_abi_cxx11_(local_18);
    std::__cxx11::string::string(local_48,(string *)psVar6);
    local_50._M_current = (char *)std::__cxx11::string::begin();
    local_58 = (char *)std::__cxx11::string::end();
    local_5a[1] = 0x5c;
    local_5a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_58,local_5a + 1,local_5a);
    pNVar4 = local_18;
    uVar7 = std::__cxx11::string::c_str();
    printf("\"%p\" [label=\"%s\"]\n",pNVar4,uVar7);
    pVar11 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
                       (&this->visited_nodes_,&local_18);
    edge = (Edge *)pVar11.first._M_node;
    local_78 = pVar11.second;
    local_88 = Node::in_edge(local_18);
    if (local_88 == (Edge *)0x0) {
      local_8c = 1;
    }
    else {
      local_98._M_node =
           (_Base_ptr)
           std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::find(&this->visited_edges_,&local_88)
      ;
      local_a0._M_node =
           (_Base_ptr)std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::end(&this->visited_edges_)
      ;
      bVar5 = std::operator!=(&local_98,&local_a0);
      if (bVar5) {
        local_8c = 1;
      }
      else {
        std::set<Edge_*,_EdgeCmp,_std::allocator<Edge_*>_>::insert(&this->visited_edges_,&local_88);
        if ((local_88->dyndep_ != (Node *)0x0) &&
           (bVar5 = Node::dyndep_pending(local_88->dyndep_), bVar5)) {
          std::__cxx11::string::string((string *)&out);
          bVar5 = DyndepLoader::LoadDyndeps(&this->dyndep_loader_,local_88->dyndep_,(string *)&out);
          if (!bVar5) {
            uVar7 = std::__cxx11::string::c_str();
            Warning("%s\n",uVar7);
          }
          std::__cxx11::string::~string((string *)&out);
        }
        sVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_88->inputs_);
        if ((sVar8 == 1) &&
           (sVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_88->outputs_),
           sVar8 == 1)) {
          ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_88->inputs_,0);
          pNVar1 = *ppNVar9;
          ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_88->outputs_,0);
          pNVar2 = *ppNVar9;
          Rule::name_abi_cxx11_(local_88->rule_);
          uVar7 = std::__cxx11::string::c_str();
          printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",pNVar1,pNVar2,uVar7);
        }
        else {
          pEVar3 = local_88;
          Rule::name_abi_cxx11_(local_88->rule_);
          uVar7 = std::__cxx11::string::c_str();
          printf("\"%p\" [label=\"%s\", shape=ellipse]\n",pEVar3,uVar7);
          local_d8._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&local_88->outputs_);
          while( true ) {
            in = std::vector<Node_*,_std::allocator<Node_*>_>::end(&local_88->outputs_);
            bVar5 = __gnu_cxx::operator!=(&local_d8,&in);
            pEVar3 = local_88;
            if (!bVar5) break;
            ppNVar10 = __gnu_cxx::
                       __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                       operator*(&local_d8);
            printf("\"%p\" -> \"%p\"\n",pEVar3,*ppNVar10);
            __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator++(&local_d8);
          }
          local_e8._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&local_88->inputs_);
          while( true ) {
            order_only = (char *)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                           (&local_88->inputs_);
            bVar5 = __gnu_cxx::operator!=
                              (&local_e8,
                               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&order_only);
            pEVar3 = local_88;
            if (!bVar5) break;
            local_f8 = "";
            in_1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&local_88->inputs_);
            index = __gnu_cxx::operator-(&local_e8,&in_1);
            bVar5 = Edge::is_order_only(pEVar3,index);
            if (bVar5) {
              local_f8 = " style=dotted";
            }
            ppNVar10 = __gnu_cxx::
                       __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                       operator*(&local_e8);
            printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n",*ppNVar10,local_88,local_f8);
            __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator++(&local_e8);
          }
        }
        local_108._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&local_88->inputs_);
        while( true ) {
          local_110._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&local_88->inputs_);
          bVar5 = __gnu_cxx::operator!=(&local_108,&local_110);
          if (!bVar5) break;
          ppNVar10 = __gnu_cxx::
                     __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                     operator*(&local_108);
          AddTarget(this,*ppNVar10);
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator++(&local_108);
        }
        local_8c = 0;
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void GraphViz::AddTarget(Node* node) {
  if (visited_nodes_.find(node) != visited_nodes_.end())
    return;

  string pathstr = node->path();
  replace(pathstr.begin(), pathstr.end(), '\\', '/');
  printf("\"%p\" [label=\"%s\"]\n", node, pathstr.c_str());
  visited_nodes_.insert(node);

  Edge* edge = node->in_edge();

  if (!edge) {
    // Leaf node.
    // Draw as a rect?
    return;
  }

  if (visited_edges_.find(edge) != visited_edges_.end())
    return;
  visited_edges_.insert(edge);

  if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
    std::string err;
    if (!dyndep_loader_.LoadDyndeps(edge->dyndep_, &err)) {
      Warning("%s\n", err.c_str());
    }
  }

  if (edge->inputs_.size() == 1 && edge->outputs_.size() == 1) {
    // Can draw simply.
    // Note extra space before label text -- this is cosmetic and feels
    // like a graphviz bug.
    printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",
           edge->inputs_[0], edge->outputs_[0], edge->rule_->name().c_str());
  } else {
    printf("\"%p\" [label=\"%s\", shape=ellipse]\n",
           edge, edge->rule_->name().c_str());
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      printf("\"%p\" -> \"%p\"\n", edge, *out);
    }
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in) {
      const char* order_only = "";
      if (edge->is_order_only(in - edge->inputs_.begin()))
        order_only = " style=dotted";
      printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n", (*in), edge, order_only);
    }
  }

  for (vector<Node*>::iterator in = edge->inputs_.begin();
       in != edge->inputs_.end(); ++in) {
    AddTarget(*in);
  }
}